

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

bool __thiscall
cmFindLibraryHelper::CheckDirectoryForName(cmFindLibraryHelper *this,string *path,Name *name)

{
  RegularExpression *this_00;
  pointer pcVar1;
  char *pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  ulong uVar12;
  string *psVar13;
  _Rb_tree_header *p_Var14;
  uint minor;
  uint major;
  string dir;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  Name *local_78;
  string *local_70;
  string local_68;
  cmFindLibraryHelper *local_48;
  string *local_40;
  string *local_38;
  
  if (name->TryRaw == true) {
    psVar13 = &this->TestPath;
    std::__cxx11::string::_M_assign((string *)psVar13);
    std::__cxx11::string::_M_append((char *)psVar13,(ulong)(name->Raw)._M_dataplus._M_p);
    bVar6 = cmsys::SystemTools::FileExists(psVar13,true);
    if (bVar6) {
      cmsys::SystemTools::CollapseFullPath(&local_68,psVar13);
      std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes(&this->BestPath);
      return true;
    }
  }
  local_80 = (long)(this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (long)(this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + path->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_68);
  local_78 = name;
  local_38 = path;
  psVar7 = cmGlobalGenerator::GetDirectoryContent(this->GG,&local_68,true);
  p_Var10 = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(psVar7->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var14) {
    local_80 = (long)local_80 >> 5;
    local_88 = (long)local_88 >> 5;
    this_00 = &local_78->Regex;
    psVar13 = &this->TestPath;
    local_40 = (string *)&this->BestPath;
    local_8c = 0;
    local_90 = 0;
    local_70 = psVar13;
    local_48 = this;
    do {
      bVar6 = cmsys::RegularExpression::find(this_00,*(char **)(p_Var10 + 1),&this_00->regmatch);
      if (bVar6) {
        std::__cxx11::string::_M_assign((string *)psVar13);
        std::__cxx11::string::_M_append((char *)psVar13,*(ulong *)(p_Var10 + 1));
        bVar6 = cmsys::SystemTools::FileIsDirectory(psVar13);
        if (!bVar6) {
          pcVar2 = (local_78->Regex).regmatch.startp[1];
          if (pcVar2 == (char *)0x0) {
            local_b8 = &local_a8;
            local_b0 = 0;
            local_a8 = 0;
          }
          else {
            local_b8 = &local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,pcVar2,(local_78->Regex).regmatch.endp[1]);
          }
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((this->Prefixes).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->Prefixes).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
          pbVar3 = (this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
          }
          pcVar2 = (local_78->Regex).regmatch.startp[2];
          if (pcVar2 == (char *)0x0) {
            local_b8 = &local_a8;
            local_b0 = 0;
            local_a8 = 0;
          }
          else {
            local_b8 = &local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,pcVar2,(local_78->Regex).regmatch.endp[2]);
          }
          _Var9 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((this->Suffixes).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->Suffixes).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
          pbVar4 = (this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
          }
          local_94 = 0;
          local_98 = 0;
          if (this->OpenBSD == true) {
            pcVar2 = (local_78->Regex).regmatch.startp[3];
            if (pcVar2 == (char *)0x0) {
              local_b8 = &local_a8;
              local_b0 = 0;
              local_a8 = 0;
            }
            else {
              local_b8 = &local_a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,pcVar2,(local_78->Regex).regmatch.endp[3]);
            }
            __isoc99_sscanf(local_b8,".%u.%u",&local_94,&local_98);
            this = local_48;
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
              this = local_48;
            }
          }
          uVar12 = (long)_Var8._M_current - (long)pbVar3 >> 5;
          uVar11 = (long)_Var9._M_current - (long)pbVar4 >> 5;
          if (((((this->BestPath)._M_string_length == 0) || (uVar12 < local_80)) ||
              ((uVar12 == local_80 && (uVar11 < local_88)))) ||
             (((psVar13 = local_70, uVar12 == local_80 && (uVar11 == local_88)) &&
              ((local_8c < local_94 || ((local_94 == local_8c && (local_90 < local_98)))))))) {
            std::__cxx11::string::_M_assign(local_40);
            local_8c = local_94;
            local_90 = local_98;
            psVar13 = local_70;
            local_88 = uVar11;
            local_80 = uVar12;
          }
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var14);
  }
  sVar5 = (this->BestPath)._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return sVar5 != 0;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectoryForName(std::string const& path,
                                                Name& name)
{
  // If the original library name provided by the user matches one of
  // the suffixes, try it first.  This allows users to search
  // specifically for a static library on some platforms (on MS tools
  // one cannot tell just from the library name whether it is a static
  // library or an import library).
  if (name.TryRaw) {
    this->TestPath = path;
    this->TestPath += name.Raw;
    if (cmSystemTools::FileExists(this->TestPath, true)) {
      this->BestPath = cmSystemTools::CollapseFullPath(this->TestPath);
      cmSystemTools::ConvertToUnixSlashes(this->BestPath);
      return true;
    }
  }

  // No library file has yet been found.
  size_type bestPrefix = this->Prefixes.size();
  size_type bestSuffix = this->Suffixes.size();
  unsigned int bestMajor = 0;
  unsigned int bestMinor = 0;

  // Search for a file matching the library name regex.
  std::string dir = path;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::set<std::string> const& files = this->GG->GetDirectoryContent(dir);
  for (std::string const& origName : files) {
#if defined(_WIN32) || defined(__APPLE__)
    std::string testName = cmSystemTools::LowerCase(origName);
#else
    std::string const& testName = origName;
#endif
    if (name.Regex.find(testName)) {
      this->TestPath = path;
      this->TestPath += origName;
      if (!cmSystemTools::FileIsDirectory(this->TestPath)) {
        // This is a matching file.  Check if it is better than the
        // best name found so far.  Earlier prefixes are preferred,
        // followed by earlier suffixes.  For OpenBSD, shared library
        // version extensions are compared.
        size_type prefix = this->GetPrefixIndex(name.Regex.match(1));
        size_type suffix = this->GetSuffixIndex(name.Regex.match(2));
        unsigned int major = 0;
        unsigned int minor = 0;
        if (this->OpenBSD) {
          sscanf(name.Regex.match(3).c_str(), ".%u.%u", &major, &minor);
        }
        if (this->BestPath.empty() || prefix < bestPrefix ||
            (prefix == bestPrefix && suffix < bestSuffix) ||
            (prefix == bestPrefix && suffix == bestSuffix &&
             (major > bestMajor ||
              (major == bestMajor && minor > bestMinor)))) {
          this->BestPath = this->TestPath;
          bestPrefix = prefix;
          bestSuffix = suffix;
          bestMajor = major;
          bestMinor = minor;
        }
      }
    }
  }

  // Use the best candidate found in this directory, if any.
  return !this->BestPath.empty();
}